

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O1

void KINForcingTerm(KINMem kin_mem,sunrealtype fnormp)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  if (kin_mem->kin_etaflag == 1) {
    dVar1 = kin_mem->kin_sJpnorm * kin_mem->kin_sJpnorm +
            kin_mem->kin_fnorm * kin_mem->kin_fnorm + kin_mem->kin_sFdotJp + kin_mem->kin_sFdotJp;
    dVar3 = 0.0;
    if (0.0 < dVar1) {
      if (dVar1 < 0.0) {
        dVar3 = sqrt(dVar1);
      }
      else {
        dVar3 = SQRT(dVar1);
      }
    }
    dVar1 = pow(kin_mem->kin_eta,kin_mem->kin_eta_alpha);
    kin_mem->kin_eta = ABS(fnormp - dVar3) / kin_mem->kin_fnorm;
  }
  else {
    dVar1 = 0.5;
  }
  if (kin_mem->kin_etaflag == 2) {
    dVar3 = kin_mem->kin_eta_gamma;
    dVar1 = pow(kin_mem->kin_eta,kin_mem->kin_eta_alpha);
    dVar1 = dVar1 * dVar3;
    dVar3 = kin_mem->kin_eta_gamma;
    dVar2 = pow(fnormp / kin_mem->kin_fnorm,kin_mem->kin_eta_alpha);
    kin_mem->kin_eta = dVar2 * dVar3;
  }
  dVar1 = (double)(~-(ulong)(dVar1 < 0.1) & (ulong)dVar1);
  dVar3 = kin_mem->kin_eta;
  if (kin_mem->kin_eta <= dVar1) {
    dVar3 = dVar1;
  }
  if (dVar3 <= 0.0001) {
    dVar3 = 0.0001;
  }
  if (0.9 <= dVar3) {
    dVar3 = 0.9;
  }
  kin_mem->kin_eta = dVar3;
  return;
}

Assistant:

static void KINForcingTerm(KINMem kin_mem, sunrealtype fnormp)
{
  sunrealtype eta_max, eta_min, eta_safe, linmodel_norm;

  eta_max  = POINT9;
  eta_min  = POINT0001;
  eta_safe = HALF;

  /* choice #1 forcing term */

  if (kin_mem->kin_etaflag == KIN_ETACHOICE1)
  {
    /* compute the norm of f + Jp , scaled L2 norm */

    linmodel_norm = SUNRsqrt((kin_mem->kin_fnorm * kin_mem->kin_fnorm) +
                             (TWO * kin_mem->kin_sFdotJp) +
                             (kin_mem->kin_sJpnorm * kin_mem->kin_sJpnorm));

    /* form the safeguarded for choice #1 */

    eta_safe         = SUNRpowerR(kin_mem->kin_eta, kin_mem->kin_eta_alpha);
    kin_mem->kin_eta = SUNRabs(fnormp - linmodel_norm) / kin_mem->kin_fnorm;
  }

  /* choice #2 forcing term */

  if (kin_mem->kin_etaflag == KIN_ETACHOICE2)
  {
    eta_safe = kin_mem->kin_eta_gamma *
               SUNRpowerR(kin_mem->kin_eta, kin_mem->kin_eta_alpha);

    kin_mem->kin_eta = kin_mem->kin_eta_gamma *
                       SUNRpowerR((fnormp / kin_mem->kin_fnorm),
                                  kin_mem->kin_eta_alpha);
  }

  /* apply safeguards */

  if (eta_safe < POINT1) { eta_safe = ZERO; }
  kin_mem->kin_eta = SUNMAX(kin_mem->kin_eta, eta_safe);
  kin_mem->kin_eta = SUNMAX(kin_mem->kin_eta, eta_min);
  kin_mem->kin_eta = SUNMIN(kin_mem->kin_eta, eta_max);

  return;
}